

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

int run_test_ipc_tcp_connection(void)

{
  int extraout_EAX;
  char *pcVar1;
  undefined8 *extraout_RDX;
  code *pcVar2;
  
  pcVar2 = on_read_connection;
  run_ipc_test("ipc_helper_tcp_connection",on_read_connection);
  if (read_cb_called == 1) {
    if (tcp_write_cb_called != 1) goto LAB_0015ff27;
    if (tcp_read_cb_called == 1) {
      if (exit_cb_called == 1) {
        return 0;
      }
      goto LAB_0015ff31;
    }
  }
  else {
    run_test_ipc_tcp_connection_cold_1();
LAB_0015ff27:
    run_test_ipc_tcp_connection_cold_2();
  }
  run_test_ipc_tcp_connection_cold_3();
LAB_0015ff31:
  run_test_ipc_tcp_connection_cold_4();
  if (pcVar2 != (code *)0x0) {
    if ((long)pcVar2 < 0) {
      if (pcVar2 != (code *)0xfffffffffffff001) {
        pcVar1 = uv_strerror((int)pcVar2);
        printf("error recving on channel: %s\n",pcVar1);
        abort();
      }
    }
    else {
      on_read_connection_cold_1();
    }
  }
  free((void *)*extraout_RDX);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ipc_tcp_connection) {
#if defined(NO_SEND_HANDLE_ON_PIPE)
  RETURN_SKIP(NO_SEND_HANDLE_ON_PIPE);
#endif
  int r = run_ipc_test("ipc_helper_tcp_connection", on_read_connection);
  ASSERT(read_cb_called == 1);
  ASSERT(tcp_write_cb_called == 1);
  ASSERT(tcp_read_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  return r;
}